

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPN::OPN(OPN *this)

{
  Chip *this_00;
  PSG *this_01;
  undefined1 *puVar1;
  undefined1 *puVar2;
  long lVar3;
  long lVar4;
  
  (this->super_OPNBase).super_Timer._vptr_Timer = (_func_int **)&PTR___cxa_pure_virtual_00219f30;
  this_00 = &(this->super_OPNBase).chip;
  Chip::Chip(this_00);
  this_01 = &(this->super_OPNBase).psg;
  PSG::PSG(this_01);
  (this->super_OPNBase).prescale = '\0';
  (this->super_OPNBase).super_Timer._vptr_Timer = (_func_int **)&PTR_SetStatus_00219f60;
  lVar3 = 0x1d8;
  do {
    Channel4::Channel4((Channel4 *)((this->super_OPNBase).super_Timer.regta + lVar3 + -10));
    lVar3 = lVar3 + 0x2e0;
  } while (lVar3 != 0xa78);
  (this->super_OPNBase).fmvolume = 0x4000;
  PSG::SetVolume(this_01,0);
  (this->super_OPNBase).csmch = (Channel4 *)&this->field_0x798;
  puVar1 = &this->field_0x238;
  puVar2 = &this->field_0x268;
  lVar3 = 0;
  do {
    *(Chip **)(this->fnum2 + lVar3 * 0x2e0 + 0x60) = this_00;
    lVar4 = 0;
    do {
      *(Chip **)(puVar1 + lVar4) = this_00;
      lVar4 = lVar4 + 0xa0;
    } while (lVar4 != 0x280);
    lVar4 = 0;
    do {
      *(undefined4 *)(puVar2 + lVar4) = 0;
      lVar4 = lVar4 + 0xa0;
    } while (lVar4 != 0x280);
    lVar3 = lVar3 + 1;
    puVar1 = puVar1 + 0x2e0;
    puVar2 = puVar2 + 0x2e0;
  } while (lVar3 != 3);
  return;
}

Assistant:

OPN::OPN()
{
	SetVolumeFM(0);
	SetVolumePSG(0);

	csmch = &ch[2];

	for (int i=0; i<3; i++)
	{
		ch[i].SetChip(&chip);
		ch[i].SetType(typeN);
	}
}